

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O1

date_time *
mjs::anon_unknown_37::date_helper::date_time_from_time(date_time *__return_storage_ptr__,double t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  tm *ptVar6;
  time_t tt;
  long local_10;
  
  local_10 = (long)(t / 1000.0);
  ptVar6 = gmtime(&local_10);
  iVar1 = ptVar6->tm_mon;
  iVar2 = ptVar6->tm_mday;
  iVar3 = ptVar6->tm_hour;
  iVar4 = ptVar6->tm_min;
  iVar5 = ptVar6->tm_sec;
  __return_storage_ptr__->year = (double)(ptVar6->tm_year + 0x76c);
  __return_storage_ptr__->month = (double)iVar1;
  __return_storage_ptr__->day = (double)iVar2;
  __return_storage_ptr__->h = (double)iVar3;
  __return_storage_ptr__->m = (double)iVar4;
  __return_storage_ptr__->s = (double)iVar5;
  __return_storage_ptr__->ms = (double)((long)t % 1000);
  return __return_storage_ptr__;
}

Assistant:

static date_time date_time_from_time(double t) {
        const auto tm = tm_from_time(t);
        return {
            static_cast<double>(tm.tm_year+1900), static_cast<double>(tm.tm_mon), static_cast<double>(tm.tm_mday),
            static_cast<double>(tm.tm_hour), static_cast<double>(tm.tm_min), static_cast<double>(tm.tm_sec), static_cast<double>(ms_from_time(t))
        };
    }